

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O2

void emit_peobj_sym(BuildCtx *ctx,char *name,uint32_t value,int sect,int type,int scl)

{
  size_t sVar1;
  size_t __n;
  char *__dest;
  PEsym sym;
  
  __n = strlen(name);
  sVar1 = strtabofs;
  if (strtab == (char *)0x0) {
    if (8 < __n) {
      strtabofs = strtabofs + __n + 1;
    }
  }
  else {
    if (__n < 9) {
      memcpy(&sym,name,__n);
      memset((void *)((long)&sym.n + __n),0,8 - __n);
    }
    else {
      sym.n.nameref[0] = 0;
      sym.n.nameref[1] = (uint32_t)strtabofs;
      __dest = strtab + strtabofs;
      memcpy(__dest,name,__n);
      __dest[__n] = '\0';
      strtabofs = sVar1 + 1 + __n;
    }
    sym.sect = (short)sect + 1;
    sym.type = (uint16_t)type;
    sym.scl = (uint8_t)scl;
    sym.naux = '\0';
    sym.value = value;
    owrite(ctx,&sym,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym(BuildCtx *ctx, const char *name, uint32_t value,
			   int sect, int type, int scl)
{
  PEsym sym;
  size_t len = strlen(name);
  if (!strtab) {  /* Pass 1: only calculate string table length. */
    if (len > 8) strtabofs += len+1;
    return;
  }
  if (len <= 8) {
    memcpy(sym.n.name, name, len);
    memset(sym.n.name+len, 0, 8-len);
  } else {
    sym.n.nameref[0] = 0;
    sym.n.nameref[1] = (uint32_t)strtabofs;
    memcpy(strtab + strtabofs, name, len);
    strtab[strtabofs+len] = 0;
    strtabofs += len+1;
  }
  sym.value = value;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = (uint16_t)type;
  sym.scl = (uint8_t)scl;
  sym.naux = 0;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
}